

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool el::Configurations::Parser::parseLine
               (string *line,string *currConfigStr,string *currLevelStr,Level *currLevel,
               Configurations *conf)

{
  bool bVar1;
  Level LVar2;
  string *psVar3;
  ulong uVar4;
  char *pcVar5;
  string *psVar6;
  ostream *poVar7;
  Level *in_RCX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  stringstream internalInfoStream_3;
  stringstream internalInfoStream_2;
  stringstream internalInfoStream_1;
  stringstream internalInfoStream;
  size_t quotesEnd;
  size_t quotesStart;
  size_t assignment;
  string currValue;
  ConfigurationType currConfig;
  string *in_stack_fffffffffffff6c0;
  string *in_stack_fffffffffffff6d0;
  ostream *in_stack_fffffffffffff6d8;
  Configurations *in_stack_fffffffffffff6e0;
  string *in_stack_fffffffffffff6f0;
  string *in_stack_fffffffffffff710;
  string local_7a0 [32];
  stringstream local_780 [16];
  ostream local_770 [376];
  string local_5f8 [32];
  stringstream local_5d8 [16];
  ostream local_5c8 [376];
  string local_450 [32];
  string local_430 [32];
  stringstream local_410 [16];
  ostream local_400 [376];
  string local_288 [32];
  stringstream local_268 [16];
  ostream local_258 [376];
  ulong local_e0;
  ulong local_d8;
  string local_d0 [32];
  string local_b0 [32];
  undefined8 local_90;
  string local_88 [32];
  undefined4 local_68;
  string local_58 [36];
  ConfigurationType local_34;
  Level *local_28;
  string *local_20;
  string *local_18;
  string *local_10;
  byte local_1;
  
  local_34 = Unknown;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::__cxx11::string::string(local_58);
  psVar3 = el::base::utils::Str::trim((string *)0x225ea4);
  std::__cxx11::string::operator=(local_10,(string *)psVar3);
  bVar1 = isComment(in_stack_fffffffffffff710);
  if (bVar1) {
    local_1 = 1;
  }
  else {
    ignoreComments(in_stack_fffffffffffff6f0);
    psVar3 = el::base::utils::Str::trim((string *)0x225f35);
    std::__cxx11::string::operator=(local_10,(string *)psVar3);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      bVar1 = isLevel(in_stack_fffffffffffff710);
      if (bVar1) {
        uVar4 = std::__cxx11::string::size();
        if (uVar4 < 3) {
          local_1 = 1;
        }
        else {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_88,(ulong)local_10);
          std::__cxx11::string::operator=(local_20,local_88);
          std::__cxx11::string::~string(local_88);
          psVar3 = el::base::utils::Str::toUpper((string *)in_stack_fffffffffffff6e0);
          std::__cxx11::string::operator=(local_20,(string *)psVar3);
          psVar3 = el::base::utils::Str::trim((string *)0x22606f);
          std::__cxx11::string::operator=(local_20,(string *)psVar3);
          std::__cxx11::string::c_str();
          LVar2 = LevelHelper::convertFromString((char *)in_stack_fffffffffffff6d8);
          *local_28 = LVar2;
          local_1 = 1;
        }
      }
      else {
        bVar1 = isConfig(in_stack_fffffffffffff6c0);
        if (bVar1) {
          local_90 = std::__cxx11::string::find((char)local_10,0x3d);
          std::__cxx11::string::substr((ulong)local_b0,(ulong)local_10);
          std::__cxx11::string::operator=(local_18,local_b0);
          std::__cxx11::string::~string(local_b0);
          psVar3 = el::base::utils::Str::toUpper((string *)in_stack_fffffffffffff6e0);
          std::__cxx11::string::operator=(local_18,(string *)psVar3);
          psVar3 = el::base::utils::Str::trim((string *)0x2261af);
          std::__cxx11::string::operator=(local_18,(string *)psVar3);
          std::__cxx11::string::c_str();
          local_34 = ConfigurationTypeHelper::convertFromString((char *)in_stack_fffffffffffff6d8);
          std::__cxx11::string::substr((ulong)local_d0,(ulong)local_10);
          std::__cxx11::string::operator=(local_58,local_d0);
          std::__cxx11::string::~string(local_d0);
          psVar3 = el::base::utils::Str::trim((string *)0x226264);
          std::__cxx11::string::operator=(local_58,(string *)psVar3);
          local_d8 = std::__cxx11::string::find((char *)local_58,0x26879f);
          local_e0 = 0xffffffffffffffff;
          if (local_d8 != 0xffffffffffffffff) {
            local_e0 = std::__cxx11::string::find((char *)local_58,0x26879f);
            while( true ) {
              bVar1 = false;
              if (local_e0 != 0xffffffffffffffff) {
                pcVar5 = (char *)std::__cxx11::string::at((ulong)local_58);
                bVar1 = *pcVar5 == '\\';
              }
              if (!bVar1) break;
              psVar6 = (string *)std::__cxx11::string::erase((ulong)local_58,local_e0 - 1);
              std::__cxx11::string::operator=(local_58,psVar6);
              local_e0 = std::__cxx11::string::find((char *)local_58,0x26879f);
            }
          }
          if ((local_d8 != 0xffffffffffffffff) && (local_e0 != 0xffffffffffffffff)) {
            if (local_e0 <= local_d8) {
              std::__cxx11::stringstream::stringstream(local_268);
              poVar7 = std::operator<<(local_258,"Configuration error - No ending quote found in [")
              ;
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_18);
              std::operator<<(poVar7,"]");
              poVar7 = std::operator<<((ostream *)&std::cerr,
                                       "ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1bb);
              poVar7 = std::operator<<(poVar7,") [(quotesStart < quotesEnd)");
              poVar7 = std::operator<<(poVar7,"] WITH MESSAGE \"");
              std::__cxx11::stringstream::str();
              poVar7 = std::operator<<(poVar7,local_288);
              poVar7 = std::operator<<(poVar7,"\"");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string(local_288);
              std::__cxx11::stringstream::~stringstream(local_268);
            }
            if (local_d8 + 1 == local_e0) {
              std::__cxx11::stringstream::stringstream(local_410);
              poVar7 = std::operator<<(local_400,"Empty configuration value for [");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_18);
              std::operator<<(poVar7,"]");
              poVar7 = std::operator<<((ostream *)&std::cerr,
                                       "ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1bc);
              poVar7 = std::operator<<(poVar7,") [(quotesStart + 1 != quotesEnd)");
              poVar7 = std::operator<<(poVar7,"] WITH MESSAGE \"");
              std::__cxx11::stringstream::str();
              poVar7 = std::operator<<(poVar7,local_430);
              poVar7 = std::operator<<(poVar7,"\"");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string(local_430);
              std::__cxx11::stringstream::~stringstream(local_410);
            }
            if ((local_d8 != local_e0) && (local_d8 + 1 != local_e0)) {
              std::__cxx11::string::substr((ulong)local_450,(ulong)local_58);
              std::__cxx11::string::operator=(local_58,local_450);
              std::__cxx11::string::~string(local_450);
            }
          }
        }
        if (*local_28 == Unknown) {
          std::__cxx11::stringstream::stringstream(local_5d8);
          poVar7 = std::operator<<(local_5c8,"Unrecognized severity level [");
          poVar7 = std::operator<<(poVar7,local_20);
          std::operator<<(poVar7,"]");
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1c3);
          poVar7 = std::operator<<(poVar7,") [*currLevel != Level::Unknown");
          poVar7 = std::operator<<(poVar7,"] WITH MESSAGE \"");
          std::__cxx11::stringstream::str();
          poVar7 = std::operator<<(poVar7,local_5f8);
          poVar7 = std::operator<<(poVar7,"\"");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_5f8);
          std::__cxx11::stringstream::~stringstream(local_5d8);
        }
        if (local_34 == Unknown) {
          std::__cxx11::stringstream::stringstream(local_780);
          poVar7 = std::operator<<(local_770,"Unrecognized configuration [");
          poVar7 = std::operator<<(poVar7,local_18);
          std::operator<<(poVar7,"]");
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
          in_stack_fffffffffffff6e0 = (Configurations *)std::ostream::operator<<(poVar7,0x1c4);
          in_stack_fffffffffffff6d8 =
               std::operator<<((ostream *)in_stack_fffffffffffff6e0,
                               ") [currConfig != ConfigurationType::Unknown");
          in_stack_fffffffffffff6d0 =
               (string *)std::operator<<(in_stack_fffffffffffff6d8,"] WITH MESSAGE \"");
          std::__cxx11::stringstream::str();
          poVar7 = std::operator<<((ostream *)in_stack_fffffffffffff6d0,local_7a0);
          poVar7 = std::operator<<(poVar7,"\"");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_7a0);
          std::__cxx11::stringstream::~stringstream(local_780);
        }
        if ((*local_28 == Unknown) || (local_34 == Unknown)) {
          local_1 = 0;
        }
        else {
          set(in_stack_fffffffffffff6e0,(Level)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
              (ConfigurationType)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
          local_1 = 1;
        }
      }
    }
    else {
      local_1 = 1;
    }
  }
  local_68 = 1;
  std::__cxx11::string::~string(local_58);
  return (bool)(local_1 & 1);
}

Assistant:

bool Configurations::Parser::parseLine(std::string* line, std::string* currConfigStr, std::string* currLevelStr,
                                       Level* currLevel,
                                       Configurations* conf) {
  ConfigurationType currConfig = ConfigurationType::Unknown;
  std::string currValue = std::string();
  *line = base::utils::Str::trim(*line);
  if (isComment(*line)) return true;
  ignoreComments(line);
  *line = base::utils::Str::trim(*line);
  if (line->empty()) {
    // Comment ignored
    return true;
  }
  if (isLevel(*line)) {
    if (line->size() <= 2) {
      return true;
    }
    *currLevelStr = line->substr(1, line->size() - 2);
    *currLevelStr = base::utils::Str::toUpper(*currLevelStr);
    *currLevelStr = base::utils::Str::trim(*currLevelStr);
    *currLevel = LevelHelper::convertFromString(currLevelStr->c_str());
    return true;
  }
  if (isConfig(*line)) {
    std::size_t assignment = line->find('=');
    *currConfigStr = line->substr(0, assignment);
    *currConfigStr = base::utils::Str::toUpper(*currConfigStr);
    *currConfigStr = base::utils::Str::trim(*currConfigStr);
    currConfig = ConfigurationTypeHelper::convertFromString(currConfigStr->c_str());
    currValue = line->substr(assignment + 1);
    currValue = base::utils::Str::trim(currValue);
    std::size_t quotesStart = currValue.find("\"", 0);
    std::size_t quotesEnd = std::string::npos;
    if (quotesStart != std::string::npos) {
      quotesEnd = currValue.find("\"", quotesStart + 1);
      while (quotesEnd != std::string::npos && currValue.at(quotesEnd - 1) == '\\') {
        currValue = currValue.erase(quotesEnd - 1, 1);
        quotesEnd = currValue.find("\"", quotesEnd + 2);
      }
    }
    if (quotesStart != std::string::npos && quotesEnd != std::string::npos) {
      // Quote provided - check and strip if valid
      ELPP_ASSERT((quotesStart < quotesEnd), "Configuration error - No ending quote found in ["
                  << currConfigStr << "]");
      ELPP_ASSERT((quotesStart + 1 != quotesEnd), "Empty configuration value for [" << currConfigStr << "]");
      if ((quotesStart != quotesEnd) && (quotesStart + 1 != quotesEnd)) {
        // Explicit check in case if assertion is disabled
        currValue = currValue.substr(quotesStart + 1, quotesEnd - 1);
      }
    }
  }
  ELPP_ASSERT(*currLevel != Level::Unknown, "Unrecognized severity level [" << *currLevelStr << "]");
  ELPP_ASSERT(currConfig != ConfigurationType::Unknown, "Unrecognized configuration [" << *currConfigStr << "]");
  if (*currLevel == Level::Unknown || currConfig == ConfigurationType::Unknown) {
    return false;  // unrecognizable level or config
  }
  conf->set(*currLevel, currConfig, currValue);
  return true;
}